

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaOverlay.cpp
# Opt level: O1

void __thiscall SchemaAdapter::~SchemaAdapter(SchemaAdapter *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Manager_type p_Var2;
  
  (this->super_ScrollAdapterBase).super_IScrollAdapter._vptr_IScrollAdapter =
       (_func_int **)&PTR__SchemaAdapter_001a9858;
  p_Var1 = (this->schema).super___shared_ptr<f8n::sdk::ISchema,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->prefs).super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var2 = (this->onChanged).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->onChanged,(_Any_data *)&this->onChanged,__destroy_functor);
  }
  cursespp::ScrollAdapterBase::~ScrollAdapterBase(&this->super_ScrollAdapterBase);
  return;
}

Assistant:

virtual ~SchemaAdapter() {
        }